

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O2

vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
* __thiscall
deqp::gls::TextureManager::getBindingsCube
          (vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
           *__return_storage_ptr__,TextureManager *this)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  pair<int,_const_glu::TextureCube_*> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = (this->m_texCube)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_texCube)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    local_30.first = p_Var1[1]._M_color;
    local_30.second = (TextureCube *)p_Var1[1]._M_parent;
    std::
    vector<std::pair<int,glu::TextureCube_const*>,std::allocator<std::pair<int,glu::TextureCube_const*>>>
    ::emplace_back<std::pair<int,glu::TextureCube_const*>>
              ((vector<std::pair<int,glu::TextureCube_const*>,std::allocator<std::pair<int,glu::TextureCube_const*>>>
                *)__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

inline vector<pair<int, const glu::TextureCube*> > TextureManager::getBindingsCube (void) const
{
	vector<pair<int, const glu::TextureCube*> > bindings;
	for (map<int, const glu::TextureCube*>::const_iterator i = m_texCube.begin(); i != m_texCube.end(); i++)
		bindings.push_back(*i);
	return bindings;
}